

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_dophase_done(connectdata *conn,_Bool connected)

{
  FTP *pFVar1;
  
  pFVar1 = (conn->data->state).proto.ftp;
  if (pFVar1->transfer != FTPTRANSFER_BODY) {
    pFVar1 = (FTP *)0x0;
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
  }
  return (CURLcode)pFVar1;
}

Assistant:

static CURLcode imap_dophase_done(struct connectdata *conn,
                                  bool connected)
{
  struct FTP *imap = conn->data->state.proto.imap;
  (void)connected;

  if(imap->transfer != FTPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  return CURLE_OK;
}